

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialShellKirchhoff.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElasticityKirchhoffIsothropic::ComputeStiffnessMatrix
          (ChElasticityKirchhoffIsothropic *this,ChMatrixRef *mC,ChVector<double> *eps,
          ChVector<double> *kur,double z_inf,double z_sup,double angle)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  uint __line;
  Scalar *pSVar4;
  Scalar *pSVar5;
  char *__assertion;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  undefined8 in_XMM1_Qb;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double h3;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
  local_d8;
  double h2;
  double h1;
  Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_3,_3,_false>
  local_a8;
  ChMatrix33<double> Q;
  
  if ((mC->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value == 6) {
    if ((mC->
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        ).
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_cols.m_value == 6) {
      Eigen::
      DenseBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>::
      setZero((DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               *)mC);
      auVar3._8_8_ = in_XMM1_Qb;
      auVar3._0_8_ = z_sup;
      auVar6._8_8_ = 0x8000000000000000;
      auVar6._0_8_ = 0x8000000000000000;
      auVar6 = vxorpd_avx512vl(auVar3,auVar6);
      if ((auVar6._0_8_ != z_inf) || (NAN(auVar6._0_8_) || NAN(z_inf))) {
        dVar1 = this->m_E;
        dVar2 = this->m_nu + 1.0;
        h1 = z_sup - z_inf;
        h2 = (z_sup * z_sup - z_inf * z_inf) * 0.5;
        dVar7 = pow(z_sup,3.0);
        dVar8 = pow(z_inf,3.0);
        h3 = (dVar7 - dVar8) * 0.3333333333333333;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = this->m_nu;
        auVar6 = vfnmadd231sd_fma(ZEXT816(0x3ff0000000000000),auVar10,auVar10);
        Q.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
             this->m_E / auVar6._0_8_;
        Q.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
             this->m_nu *
             Q.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
        Q.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0
        ;
        Q.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
             Q.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
        Q.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
             Q.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
        pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1> *)&Q,1,3);
        *pSVar5 = 0.0;
        Q.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] = 0.0
        ;
        Q.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] = 0.0
        ;
        Q.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
             dVar1 / (dVar2 + dVar2);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,1,3,3>>::operator*
                  (&local_d8,(MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *)&Q,&h1);
        Eigen::
        Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_3,_3,_false>
        ::Block(&local_a8,mC,0,0);
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,3,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
                  (&local_a8,&local_d8);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,1,3,3>>::operator*
                  (&local_d8,(MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *)&Q,&h2);
        Eigen::
        Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_3,_3,_false>
        ::Block(&local_a8,mC,0,3);
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,3,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
                  (&local_a8,&local_d8);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,1,3,3>>::operator*
                  (&local_d8,(MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *)&Q,&h2);
        Eigen::
        Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_3,_3,_false>
        ::Block(&local_a8,mC,3,0);
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,3,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
                  (&local_a8,&local_d8);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,1,3,3>>::operator*
                  (&local_d8,(MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *)&Q,&h3);
        Eigen::
        Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_3,_3,_false>
        ::Block(&local_a8,mC,3,3);
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,3,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
                  (&local_a8,&local_d8);
      }
      else {
        dVar7 = z_sup - z_inf;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = this->m_nu;
        dVar1 = this->m_nu + 1.0;
        auVar6 = vfnmadd213sd_fma(auVar11,auVar11,ZEXT816(0x3ff0000000000000));
        dVar8 = (dVar7 * this->m_E) / auVar6._0_8_;
        dVar9 = (dVar7 * dVar7 * dVar8) / 12.0;
        dVar2 = dVar7 * (this->m_E / (dVar1 + dVar1));
        pSVar4 = Eigen::
                 DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                               *)mC,0,0);
        *pSVar4 = dVar8;
        pSVar4 = Eigen::
                 DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                               *)mC,1,1);
        *pSVar4 = dVar8;
        dVar1 = this->m_nu;
        pSVar4 = Eigen::
                 DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                               *)mC,0,1);
        *pSVar4 = dVar8 * dVar1;
        dVar1 = this->m_nu;
        pSVar4 = Eigen::
                 DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                               *)mC,1,0);
        *pSVar4 = dVar8 * dVar1;
        pSVar4 = Eigen::
                 DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                               *)mC,2,2);
        *pSVar4 = dVar2;
        pSVar4 = Eigen::
                 DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                               *)mC,3,3);
        *pSVar4 = dVar9;
        pSVar4 = Eigen::
                 DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                               *)mC,4,4);
        *pSVar4 = dVar9;
        dVar1 = this->m_nu;
        pSVar4 = Eigen::
                 DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                               *)mC,3,4);
        *pSVar4 = dVar9 * dVar1;
        dVar1 = this->m_nu;
        pSVar4 = Eigen::
                 DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                               *)mC,4,3);
        *pSVar4 = dVar9 * dVar1;
        pSVar4 = Eigen::
                 DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                               *)mC,5,5);
        *pSVar4 = (dVar7 * dVar7 * dVar2) / 12.0;
      }
      return;
    }
    __assertion = "mC.cols() == 6";
    __line = 0x75;
  }
  else {
    __assertion = "mC.rows() == 6";
    __line = 0x74;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChMaterialShellKirchhoff.cpp"
                ,__line,
                "virtual void chrono::fea::ChElasticityKirchhoffIsothropic::ComputeStiffnessMatrix(ChMatrixRef, const ChVector<> &, const ChVector<> &, const double, const double, const double)"
               );
}

Assistant:

void ChElasticityKirchhoffIsothropic::ComputeStiffnessMatrix(ChMatrixRef mC,
                                                        const ChVector<>& eps,
                                                        const ChVector<>& kur,
                                                        const double z_inf,
                                                        const double z_sup,
                                                        const double angle) {
    assert(mC.rows() == 6);
    assert(mC.cols() == 6);

    mC.setZero();

    if (z_inf == -z_sup) {
        // simplified computation for centered layer
        double h = z_sup - z_inf;
        double G = m_E / (2. * (1. + m_nu));
        double C = m_E * h / (1. - m_nu * m_nu);
        double D = C * h * h / 12.;
        double F = G * h * h * h / 12.;
        mC(0, 0) = C;
		mC(1, 1) = C;
        mC(0, 1) = m_nu * C;
        mC(1, 0) = m_nu * C;
        mC(2, 2) = G * h;
        mC(3, 3) = D;
		mC(4, 4) = D;
        mC(3, 4) = m_nu * D;
        mC(4, 3) = m_nu * D;
        mC(5, 5) = F;
    } else {
        double G = m_E / (2. * (1. + m_nu));
        double h1 = z_sup - z_inf;
        double h2 = 0.5 * (pow(z_sup, 2) - pow(z_inf, 2));
        double h3 = (1. / 3.) * (pow(z_sup, 3) - pow(z_inf, 3));
		ChMatrix33<> Q;
		Q(0, 0) = m_E / (1. - m_nu * m_nu);
		Q(0, 1) = m_nu * Q(0, 0);
		Q(0, 2) = 0;
		Q(1, 0) = Q(0, 1);
		Q(1, 1) = Q(0, 0);
		Q(1, 3) = 0;
		Q(2, 0) = 0;
		Q(2, 1) = 0;
		Q(2, 2) = G;
		mC.block<3,3>(0,0) = Q * h1;
		mC.block<3,3>(0,3) = Q * h2;
		mC.block<3,3>(3,0) = Q * h2;
		mC.block<3,3>(3,3) = Q * h3;
    }
}